

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsStateQueryUtil.hpp
# Opt level: O2

bool __thiscall
deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<unsigned_char>::verifyValidity
          (StateQueryMemoryWriteGuard<unsigned_char> *this,ResultCollector *result)

{
  allocator<char> local_29;
  string local_28;
  
  if (this->m_preguard == 0xde) {
    if (this->m_postguard == 0xde) {
      if (this->m_value != 0xde) {
        return true;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_28,"Get* did not return a value",&local_29);
      tcu::ResultCollector::fail(result,&local_28);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_28,"post-guard value was modified",&local_29);
      tcu::ResultCollector::fail(result,&local_28);
    }
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_28,"pre-guard value was modified",&local_29);
    tcu::ResultCollector::fail(result,&local_28);
  }
  std::__cxx11::string::~string((string *)&local_28);
  return false;
}

Assistant:

bool StateQueryMemoryWriteGuard<T>::verifyValidity (tcu::ResultCollector& result) const
{
	using tcu::TestLog;

	if (isPreguardContaminated())
	{
		result.fail("pre-guard value was modified");
		return false;
	}
	else if (isPostguardContaminated())
	{
		result.fail("post-guard value was modified");
		return false;
	}
	else if (isUndefined())
	{
		result.fail("Get* did not return a value");
		return false;
	}

	return true;
}